

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::runtime_cs_ext::create_co(runtime_cs_ext *this,var *func)

{
  bool bVar1;
  type_info *ptVar2;
  callable *pcVar3;
  function *pfVar4;
  object_method *poVar5;
  long *plVar6;
  initializer_list<cs_impl::any> __l;
  allocator_type local_101;
  any local_100;
  shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> local_f8;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_e8;
  uint *local_c8;
  long local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint *local_a8;
  long local_a0;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  routine_t local_84;
  fiber_callable local_80;
  function<void_()> local_58;
  function<void_()> local_38;
  
  ptVar2 = any::type(func);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::callable::typeinfo);
  if (bVar1) {
    pcVar3 = any::const_val<cs::callable>(func);
    ptVar2 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target_type(&pcVar3->mFunc);
    bVar1 = std::type_info::operator!=(ptVar2,(type_info *)&cs::function::typeinfo);
    if (bVar1) {
      plVar6 = (long *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_a8,"Only can create coroutine from covscript function.",
                 (allocator *)&local_80);
      *plVar6 = (long)(plVar6 + 2);
      if (local_a8 == &local_98) {
        *(uint *)(plVar6 + 2) = local_98;
        *(undefined4 *)((long)plVar6 + 0x14) = uStack_94;
        *(undefined4 *)(plVar6 + 3) = uStack_90;
        *(undefined4 *)((long)plVar6 + 0x1c) = uStack_8c;
      }
      else {
        *plVar6 = (long)local_a8;
        plVar6[2] = CONCAT44(uStack_94,local_98);
      }
      plVar6[1] = local_a0;
      local_a0 = 0;
      local_98 = local_98 & 0xffffff00;
      local_a8 = &local_98;
      __cxa_throw(plVar6,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    pfVar4 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target<cs::function>(&pcVar3->mFunc);
    local_80.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80.context = &pfVar4->mContext;
    local_80.func = pfVar4;
    std::function<void()>::function<cs_impl::runtime_cs_ext::fiber_callable,void>
              ((function<void()> *)&local_38,&local_80);
    local_100.mDat._0_4_ = fiber::create(&pfVar4->mContext,&local_38);
    std::make_shared<cs_impl::runtime_cs_ext::fiber_holder_impl,unsigned_int>((uint *)&local_f8);
    any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>((any *)this,&local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_f8.
                super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::_Function_base::~_Function_base(&local_38.super__Function_base);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_80.args);
  }
  else {
    ptVar2 = any::type(func);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::object_method::typeinfo);
    if (bVar1) {
      poVar5 = any::const_val<cs::object_method>(func);
      pcVar3 = any::const_val<cs::callable>(&poVar5->callable);
      ptVar2 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target_type(&pcVar3->mFunc);
      bVar1 = std::type_info::operator!=(ptVar2,(type_info *)&cs::function::typeinfo);
      if (bVar1) {
        plVar6 = (long *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&local_c8,"Only can create coroutine from covscript function.",
                   (allocator *)&local_80);
        *plVar6 = (long)(plVar6 + 2);
        if (local_c8 == &local_b8) {
          *(uint *)(plVar6 + 2) = local_b8;
          *(undefined4 *)((long)plVar6 + 0x14) = uStack_b4;
          *(undefined4 *)(plVar6 + 3) = uStack_b0;
          *(undefined4 *)((long)plVar6 + 0x1c) = uStack_ac;
        }
        else {
          *plVar6 = (long)local_c8;
          plVar6[2] = CONCAT44(uStack_b4,local_b8);
        }
        plVar6[1] = local_c0;
        local_c0 = 0;
        local_b8 = local_b8 & 0xffffff00;
        local_c8 = &local_b8;
        __cxa_throw(plVar6,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
      }
      pfVar4 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs::function>(&pcVar3->mFunc);
      local_100.mDat = (poVar5->object).mDat;
      if (local_100.mDat != (proxy *)0x0) {
        (local_100.mDat)->refcount = (local_100.mDat)->refcount + 1;
      }
      __l._M_len = 1;
      __l._M_array = &local_100;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&local_e8,__l,&local_101);
      local_80.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_80.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_80.args.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_80.context = &pfVar4->mContext;
      local_80.func = pfVar4;
      std::function<void()>::function<cs_impl::runtime_cs_ext::fiber_callable,void>
                ((function<void()> *)&local_58,&local_80);
      local_84 = fiber::create(&pfVar4->mContext,&local_58);
      std::make_shared<cs_impl::runtime_cs_ext::fiber_holder_impl,unsigned_int>((uint *)&local_f8);
      any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>((any *)this,&local_f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f8.
                  super___shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::_Function_base::~_Function_base(&local_58.super__Function_base);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_80.args);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_e8);
      any::recycle(&local_100);
    }
    else {
      any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    }
  }
  return (var)(proxy *)this;
}

Assistant:

var create_co(const var &func)
		{
			if (func.type() == typeid(callable)) {
				const cs::callable::function_type &impl_f = func.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(),fiber_callable(fptr)));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				const cs::callable::function_type &impl_f = om.callable.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, {om.object})));
			}
			return null_pointer;
		}